

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::FArrayBox>::FabArray
          (FabArray<amrex::FArrayBox> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::FArrayBox> *factory)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  
  FabArrayBase::FabArrayBase(&this->super_FabArrayBase);
  (this->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__FabArray_00837c98;
  iVar2 = (*factory->_vptr_FabFactory[5])(factory);
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)CONCAT44(extraout_var,iVar2);
  (this->m_dallocator).m_arena = (Arena *)0x0;
  this->define_function_called = false;
  (this->m_fabs_v).super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fabs_v).super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hp_arrays = (void *)0x0;
  (this->m_arrays).hp = (Array4<double> *)0x0;
  (this->m_const_arrays).hp = (Array4<const_double> *)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tags).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_tags).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->shmem).n_values = 0;
  (this->shmem).n_points = 0;
  (this->fbd)._M_t.
  super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FBData<amrex::FArrayBox> *)0x0;
  (this->pcd)._M_t.
  super___uniq_ptr_impl<amrex::PCData<amrex::FArrayBox>,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::PCData<amrex::FArrayBox>_*,_std::default_delete<amrex::PCData<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::PCData<amrex::FArrayBox>_*,_false>._M_head_impl =
       (PCData<amrex::FArrayBox> *)0x0;
  (this->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabArray<amrex::FArrayBox> *)0x0;
  DAT_00843380 = DAT_00843380 + 1;
  iVar1 = FabArrayBase::m_FA_stats + 1;
  if (FabArrayBase::m_FA_stats < DAT_00843374) {
    iVar1 = DAT_00843374;
  }
  FabArrayBase::m_FA_stats = FabArrayBase::m_FA_stats + 1;
  DAT_00843374 = iVar1;
  (*(this->super_FabArrayBase)._vptr_FabArrayBase[3])
            (this,bxs,dm,(ulong)(uint)nvar,ngrow,info,
             (FabFactory<amrex::FArrayBox> *)CONCAT44(extraout_var,iVar2),&this->fbd,&this->m_fabs_v
             ,&this->m_tags);
  return;
}

Assistant:

FabArray<FAB>::FabArray (const BoxArray&            bxs,
                         const DistributionMapping& dm,
                         int                        nvar,
                         const IntVect&             ngrow,
                         const MFInfo&              info,
                         const FabFactory<FAB>&     factory)
    : m_factory(factory.clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(bxs,dm,nvar,ngrow,info,*m_factory);
}